

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O2

void __thiscall
KeyData_FromStringPrivkeyHex_Test::KeyData_FromStringPrivkeyHex_Test
          (KeyData_FromStringPrivkeyHex_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005bd2d0;
  return;
}

Assistant:

TEST(KeyData, FromStringPrivkeyHex) {
  std::string key1 = "[3456789a/1h/2/3h]305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_TRUE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG",
        obj.GetPrivkey().GetWif().c_str());
    EXPECT_STREQ(
        "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
        obj.GetPrivkey().GetHex().c_str());
    EXPECT_STREQ(
        "031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3']031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h]KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}